

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

void SequentializeParallelCopy(VmModule *module,VmInstruction *p)

{
  uint uVar1;
  uint uVar2;
  VmValue **ppVVar3;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  VmInstruction *replacement;
  VmInstruction *pVVar8;
  bool bVar9;
  VmValue *pVVar10;
  VmValue *pVVar11;
  ulong uVar12;
  uint uVar13;
  VmValue *pVVar14;
  VmType type;
  VmType type_00;
  VmType type_01;
  VmType type_02;
  VmValue *in_stack_ffffffffffffffb8;
  
  uVar13 = (p->arguments).count;
  uVar6 = (ulong)uVar13;
  if (uVar13 != 0) {
    bVar9 = false;
    uVar13 = 0;
LAB_0028326c:
    do {
      ppVVar3 = (p->arguments).data;
      uVar5 = (uint)uVar6;
      do {
        pVVar14 = ppVVar3[uVar13];
        if ((pVVar14 == (VmValue *)0x0) || (pVVar14->typeID != 2)) {
          pVVar14 = (VmValue *)0x0;
        }
        uVar1 = uVar13 + 1;
        if (uVar5 <= uVar1) goto LAB_00283640;
        pVVar8 = (VmInstruction *)ppVVar3[uVar1];
        uVar2 = *(uint *)(pVVar14[1].users.little + 7);
        if ((pVVar8->color != 0) && (pVVar8->color == uVar2)) {
LAB_00283543:
          anon_unknown.dwarf_22bf96::ReplaceValueUsersWith
                    (module,pVVar14,&pVVar8->super_VmValue,(uint *)0x0);
          if (((p->arguments).count <= uVar13) ||
             (VmValue::RemoveUse((p->arguments).data[uVar13],&p->super_VmValue),
             (p->arguments).count <= uVar1)) goto LAB_00283640;
          VmValue::RemoveUse((p->arguments).data[uVar1],&p->super_VmValue);
          uVar5 = (p->arguments).count;
          if (uVar5 == 0) goto LAB_0028365f;
          if (uVar5 <= uVar1) goto LAB_00283640;
          ppVVar3 = (p->arguments).data;
          ppVVar3[uVar1] = ppVVar3[uVar5 - 1];
          ppVVar3 = (p->arguments).data;
          uVar5 = uVar5 - 2;
          uVar6 = (ulong)uVar5;
          ppVVar3[uVar13] = ppVVar3[uVar6];
          (p->arguments).count = uVar5;
          bVar9 = true;
          if (uVar5 <= uVar13) goto LAB_002835d6;
          goto LAB_0028326c;
        }
        if (uVar2 == 0) {
          type_02.structType = (TypeBase *)0x4f;
          type_02._0_8_ = (pVVar8->super_VmValue).type.structType;
          pVVar8 = anon_unknown.dwarf_22bf96::CreateInstruction
                             ((anon_unknown_dwarf_22bf96 *)module,(VmModule *)0x0,
                              *(SynBase **)&(pVVar8->super_VmValue).type,type_02,
                              (VmInstructionType)pVVar8,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0
                              ,(VmValue *)0x0,in_stack_ffffffffffffffb8);
          pcVar4 = (pVVar14->comment).end;
          (pVVar8->super_VmValue).comment.begin = (pVVar14->comment).begin;
          (pVVar8->super_VmValue).comment.end = pcVar4;
          goto LAB_00283543;
        }
        uVar7 = 1;
        while( true ) {
          if (uVar6 <= uVar7) goto LAB_00283640;
          if (*(uint *)(ppVVar3[uVar7][1].users.little + 7) == uVar2) break;
          uVar12 = uVar7 + 1;
          uVar7 = uVar7 + 2;
          if (uVar6 <= uVar12) {
            type_01.structType = (TypeBase *)0x4f;
            type_01._0_8_ = (pVVar8->super_VmValue).type.structType;
            pVVar8 = anon_unknown.dwarf_22bf96::CreateInstruction
                               ((anon_unknown_dwarf_22bf96 *)module,(VmModule *)0x0,
                                *(SynBase **)&(pVVar8->super_VmValue).type,type_01,
                                (VmInstructionType)pVVar8,(VmValue *)0x0,(VmValue *)0x0,
                                (VmValue *)0x0,(VmValue *)0x0,in_stack_ffffffffffffffb8);
            pVVar8->color = *(uint *)(pVVar14[1].users.little + 7);
            pcVar4 = (pVVar14->comment).end;
            (pVVar8->super_VmValue).comment.begin = (pVVar14->comment).begin;
            (pVVar8->super_VmValue).comment.end = pcVar4;
            goto LAB_00283543;
          }
        }
        uVar13 = uVar13 + 2;
      } while (uVar13 < uVar5);
      if (!bVar9) {
        ppVVar3 = (p->arguments).data;
        pVVar14 = *ppVVar3;
        if ((pVVar14 == (VmValue *)0x0) || (pVVar14->typeID != 2)) {
          pVVar14 = (VmValue *)0x0;
        }
        if (uVar5 == 1) {
LAB_00283640:
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x199,
                        "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                       );
        }
        pVVar11 = ppVVar3[1];
        if ((pVVar11 == (VmValue *)0x0) || (pVVar11->typeID != 2)) {
          pVVar11 = (VmValue *)0x0;
        }
        uVar7 = 1;
        do {
          if (uVar6 <= uVar7) goto LAB_00283640;
          pVVar10 = ppVVar3[uVar7];
          if (*(int *)(pVVar10[1].users.little + 7) == *(int *)(pVVar14[1].users.little + 7))
          goto LAB_00283371;
          uVar12 = uVar7 + 1;
          uVar7 = uVar7 + 2;
        } while (uVar12 < uVar6);
        pVVar10 = (VmValue *)0x0;
LAB_00283371:
        type.structType = (TypeBase *)0x4f;
        type._0_8_ = (pVVar10->type).structType;
        pVVar8 = anon_unknown.dwarf_22bf96::CreateInstruction
                           ((anon_unknown_dwarf_22bf96 *)module,(VmModule *)0x0,
                            *(SynBase **)&pVVar10->type,type,(VmInstructionType)pVVar10,
                            (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                            in_stack_ffffffffffffffb8);
        pcVar4 = (pVVar10->comment).end;
        (pVVar8->super_VmValue).comment.begin = (pVVar10->comment).begin;
        (pVVar8->super_VmValue).comment.end = pcVar4;
        type_00.structType = (TypeBase *)0x4f;
        type_00._0_8_ = (pVVar11->type).structType;
        replacement = anon_unknown.dwarf_22bf96::CreateInstruction
                                ((anon_unknown_dwarf_22bf96 *)module,(VmModule *)0x0,
                                 *(SynBase **)&pVVar11->type,type_00,(VmInstructionType)pVVar11,
                                 (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                                 in_stack_ffffffffffffffb8);
        replacement->color = *(uint *)(pVVar14[1].users.little + 7);
        pcVar4 = (pVVar14->comment).end;
        (replacement->super_VmValue).comment.begin = (pVVar14->comment).begin;
        (replacement->super_VmValue).comment.end = pcVar4;
        anon_unknown.dwarf_22bf96::ReplaceValueUsersWith
                  (module,pVVar14,&replacement->super_VmValue,(uint *)0x0);
        if (((p->arguments).count == 0) ||
           (VmValue::RemoveUse(*(p->arguments).data,&p->super_VmValue), (p->arguments).count < 2))
        goto LAB_00283640;
        VmValue::RemoveUse((p->arguments).data[1],&p->super_VmValue);
        uVar13 = (p->arguments).count;
        if (uVar13 == 1) goto LAB_00283640;
        if (uVar13 == 0) {
LAB_0028365f:
          __assert_fail("count > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x172,"T &SmallArray<VmValue *, 4>::back() [T = VmValue *, N = 4]");
        }
        ppVVar3 = (p->arguments).data;
        ppVVar3[1] = ppVVar3[uVar13 - 1];
        ppVVar3 = (p->arguments).data;
        uVar13 = uVar13 - 2;
        uVar6 = (ulong)uVar13;
        *ppVVar3 = ppVVar3[uVar6];
        (p->arguments).count = uVar13;
        if (uVar13 == 0) {
          return;
        }
        uVar7 = 1;
        do {
          if (uVar6 <= uVar7) goto LAB_00283640;
          ppVVar3 = (p->arguments).data;
          pVVar11 = ppVVar3[uVar7];
          if ((pVVar11 == (VmValue *)0x0) || (pVVar11->typeID != 2)) {
            pVVar11 = (VmValue *)0x0;
          }
          if (*(int *)(pVVar11[1].users.little + 7) == *(int *)(pVVar14[1].users.little + 7)) {
            ppVVar3[uVar7] = &pVVar8->super_VmValue;
            VmValue::RemoveUse(pVVar11,&p->super_VmValue);
            VmValue::AddUse(&pVVar8->super_VmValue,&p->super_VmValue);
            uVar6 = (ulong)(p->arguments).count;
          }
          uVar12 = uVar7 + 1;
          uVar7 = uVar7 + 2;
        } while (uVar12 < uVar6);
      }
LAB_002835d6:
      bVar9 = false;
      uVar13 = 0;
    } while ((int)uVar6 != 0);
  }
  return;
}

Assistant:

void SequentializeParallelCopy(VmModule *module, VmInstruction *p)
{
	while(!p->arguments.empty())
	{
		bool changed = false;

		// Handle leaf nodes
		for(unsigned argumentPos = 0; argumentPos < p->arguments.size();)
		{
			VmInstruction *b = getType<VmInstruction>(p->arguments[argumentPos]);
			VmInstruction *a = getType<VmInstruction>(p->arguments[argumentPos + 1]);

			bool remove = false;

			// If the colors are the same, no need to move
			if(a->color != 0 && a->color == b->color)
			{
				ReplaceValueUsersWith(module, b, a, NULL);

				remove = true;
			}

			// If the target has no fixed register, extract as a move
			if(!remove && b->color == 0)
			{
				VmInstruction *copy = CreateMov(module, NULL, a->type, a);

				copy->comment = b->comment;

				ReplaceValueUsersWith(module, b, copy, NULL);

				remove = true;
			}

			// If the target fixed register value is not read by other copies, we can extract is as move
			if(!remove && b->color != 0)
			{
				bool isRead = false;

				for(unsigned k = 0; k < p->arguments.size(); k += 2)
				{
					VmInstruction *read = getType<VmInstruction>(p->arguments[k + 1]);

					if(read->color == b->color)
					{
						isRead = true;
						break;
					}
				}

				if(!isRead)
				{
					VmInstruction *copy = CreateMov(module, NULL, a->type, a);

					copy->color = b->color;
					copy->comment = b->comment;

					ReplaceValueUsersWith(module, b, copy, NULL);

					remove = true;
				}
			}

			if(remove)
			{
				p->arguments[argumentPos]->RemoveUse(p);
				p->arguments[argumentPos + 1]->RemoveUse(p);

				p->arguments[argumentPos + 1] = p->arguments.back();
				p->arguments.pop_back();

				p->arguments[argumentPos] = p->arguments.back();
				p->arguments.pop_back();

				changed = true;
			}
			else
			{
				argumentPos += 2;
			}
		}

		if(!changed)
		{
			// Take the first copy to break the loop
			unsigned argumentPos = 0;

			VmInstruction *b = getType<VmInstruction>(p->arguments[argumentPos]);
			VmInstruction *a = getType<VmInstruction>(p->arguments[argumentPos + 1]);

			// Find current destination user
			VmInstruction *user = NULL;

			for(unsigned k = 0; k < p->arguments.size(); k += 2)
			{
				VmInstruction *a2 = getType<VmInstruction>(p->arguments[k + 1]);

				if(a2->color == b->color)
				{
					user = a2;
					break;
				}
			}

			// Create a new location for A (uncolored!)
			VmInstruction *backup = CreateMov(module, NULL, user->type, user);

			backup->comment = user->comment;

			// Create a copy
			VmInstruction *copy = CreateMov(module, NULL, a->type, a);

			copy->color = b->color;
			copy->comment = b->comment;

			ReplaceValueUsersWith(module, b, copy, NULL);

			// Remove argument
			p->arguments[argumentPos]->RemoveUse(p);
			p->arguments[argumentPos + 1]->RemoveUse(p);

			p->arguments[argumentPos + 1] = p->arguments.back();
			p->arguments.pop_back();

			p->arguments[argumentPos] = p->arguments.back();
			p->arguments.pop_back();

			// Replace all uses of original color with a copy
			for(unsigned k = 0; k < p->arguments.size(); k += 2)
			{
				VmInstruction *a2 = getType<VmInstruction>(p->arguments[k + 1]);

				if(a2->color == b->color)
				{
					p->arguments[k + 1] = backup;

					a2->RemoveUse(p);
					backup->AddUse(p);
				}
			}
		}
	}
}